

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O2

void __thiscall
(anonymous_namespace)::BlendA64MaskTest8B_d16_RandomValues_Test::
~BlendA64MaskTest8B_d16_RandomValues_Test(BlendA64MaskTest8B_d16_RandomValues_Test *this)

{
  anon_unknown.dwarf_17b8f50::BlendA64MaskTest8B_d16_RandomValues_Test::
  ~BlendA64MaskTest8B_d16_RandomValues_Test
            ((BlendA64MaskTest8B_d16_RandomValues_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(BlendA64MaskTest8B_d16, RandomValues) {
  for (int bsize = 0; bsize < BLOCK_SIZES_ALL && !HasFatalFailure(); ++bsize) {
    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = rng_.Rand8();
      dst_tst_[i] = rng_.Rand8();

      src0_[i] = rng_.Rand16() & kSrcMaxBitsMask;
      src1_[i] = rng_.Rand16() & kSrcMaxBitsMask;
    }

    for (int i = 0; i < kMaxMaskSize; ++i)
      mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

    RunTest(bsize, 1);
  }
}